

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadField(BinaryReader *this,TypeMut *out_value)

{
  char *pcVar1;
  bool bVar2;
  Enum EVar3;
  Result result;
  byte local_35;
  Type TStack_34;
  uint8_t mutable_;
  Enum local_2c;
  Type local_28;
  Type field_type;
  TypeMut *out_value_local;
  BinaryReader *this_local;
  
  field_type = (Type)out_value;
  local_2c = (Enum)ReadType(this,&local_28,"field type");
  bVar2 = Failed((Result)local_2c);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    TStack_34 = local_28;
    bVar2 = IsConcreteType(this,local_28);
    if (bVar2) {
      local_35 = 0;
      result = ReadU8(this,&local_35,"field mutability");
      bVar2 = Failed(result);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else if (local_35 < 2) {
        *(Type *)field_type = local_28;
        *(bool *)((long)field_type + 8) = local_35 != 0;
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
      else {
        PrintError(this,"field mutability must be 0 or 1");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
    else {
      EVar3 = Type::operator_cast_to_Enum(&local_28);
      pcVar1 = "\n\n";
      if (EVar3 < Any) {
        pcVar1 = "  -";
      }
      EVar3 = Type::operator_cast_to_Enum(&local_28);
      if (EVar3 < ~I64) {
        EVar3 = -EVar3;
      }
      PrintError(this,"expected valid field type (got %s%#x)",pcVar1 + 2,(ulong)(uint)EVar3);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadField(TypeMut* out_value) {
  // TODO: Reuse for global header too?
  Type field_type;
  CHECK_RESULT(ReadType(&field_type, "field type"));
  ERROR_UNLESS(IsConcreteType(field_type),
               "expected valid field type (got " PRItypecode ")",
               WABT_PRINTF_TYPE_CODE(field_type));

  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadU8(&mutable_, "field mutability"));
  ERROR_UNLESS(mutable_ <= 1, "field mutability must be 0 or 1");
  out_value->type = field_type;
  out_value->mutable_ = mutable_;
  return Result::Ok;
}